

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coder.h
# Opt level: O2

void __thiscall Encoder::put8(Encoder *this,uchar v)

{
  size_t sVar1;
  S2LogMessage local_20;
  
  sVar1 = avail(this);
  if (sVar1 != 0) {
    *this->buf_ = v;
    this->buf_ = this->buf_ + 1;
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
             ,0x1d4,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_20.stream_,"Check failed: (avail()) >= (sizeof(v)) ");
  abort();
}

Assistant:

inline void Encoder::put8(unsigned char v) {
  S2_DCHECK_GE(avail(), sizeof(v));
  *buf_ = v;
  buf_ += sizeof(v);
}